

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

BufferSp __thiscall
vkt::SpirVAssembly::createCompositeBuffer<unsigned_int>(SpirVAssembly *this,uint number)

{
  Buffer<unsigned_int> *this_00;
  SharedPtrStateBase *extraout_RDX;
  BufferSp BVar1;
  allocator_type local_3d;
  uint number_local;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  number_local = number;
  this_00 = (Buffer<unsigned_int> *)operator_new(0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38,1,&number_local,
             &local_3d);
  Buffer<unsigned_int>::Buffer
            (this_00,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
            ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)this,(BufferInterface *)this_00);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_38);
  BVar1.m_state = extraout_RDX;
  BVar1.m_ptr = (BufferInterface *)this;
  return BVar1;
}

Assistant:

BufferSp createCompositeBuffer(T number)
{
	return BufferSp(new Buffer<T>(vector<T>(1, number)));
}